

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall Pathie::Path::split(Path *this,Path *dname,Path *bname)

{
  Path local_40;
  
  dirname(&local_40,(char *)this);
  operator=(dname,&local_40);
  std::__cxx11::string::_M_dispose();
  basename(&local_40,(char *)this);
  operator=(bname,&local_40);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Path::split(Path& dname, Path& bname) const
{
  dname = dirname();
  bname = basename();
}